

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlsa_digital_filter_coefficients_to_mel_cepstrum.cc
# Opt level: O2

bool __thiscall
sptk::MlsaDigitalFilterCoefficientsToMelCepstrum::Run
          (MlsaDigitalFilterCoefficientsToMelCepstrum *this,
          vector<double,_std::allocator<double>_> *mlsa_digital_filter_coefficients,
          vector<double,_std::allocator<double>_> *mel_cepstrum)

{
  uint uVar1;
  pointer __src;
  pointer pdVar2;
  long lVar3;
  ulong uVar4;
  size_t __n;
  bool bVar5;
  size_type __new_size;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if (mel_cepstrum != (vector<double,_std::allocator<double>_> *)0x0) {
      lVar3 = (long)(mlsa_digital_filter_coefficients->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(mlsa_digital_filter_coefficients->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      __new_size = lVar3 >> 3;
      bVar5 = false;
      if (__new_size == (long)this->num_order_ + 1U) {
        if ((long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start != lVar3) {
          std::vector<double,_std::allocator<double>_>::resize(mel_cepstrum,__new_size);
        }
        __src = (mlsa_digital_filter_coefficients->
                super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
                ._M_start;
        if ((this->alpha_ != 0.0) || (NAN(this->alpha_))) {
          pdVar2 = (mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar1 = this->num_order_;
          pdVar2[(int)uVar1] = __src[(int)uVar1];
          for (uVar4 = (ulong)uVar1; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
            pdVar2[uVar4 - 1] = this->alpha_ * __src[uVar4] + __src[uVar4 - 1];
          }
          bVar5 = true;
        }
        else {
          bVar5 = true;
          __n = (long)(mlsa_digital_filter_coefficients->
                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)__src;
          if (__n != 0) {
            memmove((mel_cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start,__src,__n);
          }
        }
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool MlsaDigitalFilterCoefficientsToMelCepstrum::Run(
    const std::vector<double>& mlsa_digital_filter_coefficients,
    std::vector<double>* mel_cepstrum) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      mlsa_digital_filter_coefficients.size() !=
          static_cast<std::size_t>(length) ||
      NULL == mel_cepstrum) {
    return false;
  }

  // Prepare memories.
  if (mel_cepstrum->size() != static_cast<std::size_t>(length)) {
    mel_cepstrum->resize(length);
  }

  // There is no need to convert input when alpha is zero.
  if (0.0 == alpha_) {
    std::copy(mlsa_digital_filter_coefficients.begin(),
              mlsa_digital_filter_coefficients.end(), mel_cepstrum->begin());
    return true;
  }

  const double* b(&(mlsa_digital_filter_coefficients[0]));
  double* c(&((*mel_cepstrum)[0]));

  c[num_order_] = b[num_order_];
  for (int m(num_order_ - 1); 0 <= m; --m) {
    c[m] = b[m] + alpha_ * b[m + 1];
  }

  return true;
}